

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniFB_internal.c
# Opt level: O1

void calc_dst_factor(SWindowData *window_data,uint32_t width,uint32_t height)

{
  if (window_data->dst_width == 0) {
    window_data->dst_width = width;
  }
  window_data->factor_x = (float)window_data->dst_offset_x / (float)width;
  window_data->factor_width = (float)window_data->dst_width / (float)width;
  if (window_data->dst_height == 0) {
    window_data->dst_height = height;
  }
  window_data->factor_y = (float)window_data->dst_offset_y / (float)height;
  window_data->factor_height = (float)window_data->dst_height / (float)height;
  return;
}

Assistant:

void 
calc_dst_factor(SWindowData *window_data, uint32_t width, uint32_t height) {
    if (window_data->dst_width == 0) {
        window_data->dst_width = width;
    }
    window_data->factor_x     = (float) window_data->dst_offset_x / (float) width;
    window_data->factor_width = (float) window_data->dst_width    / (float) width;

    if (window_data->dst_height == 0) {
        window_data->dst_height = height;
    }
    window_data->factor_y      = (float) window_data->dst_offset_y / (float) height;
    window_data->factor_height = (float) window_data->dst_height   / (float) height;
}